

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall
GEO::geofile::translate_data(geofile *this,double *delta_x,double *delta_y,double *delta_z)

{
  _Rb_tree_node_base *p_Var1;
  bool local_21;
  
  make_coherent(this,&local_21);
  simplify_data(this);
  for (p_Var1 = (this->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->points_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    p_Var1[1]._M_parent = (_Base_ptr)((double)p_Var1[1]._M_parent + *delta_x);
    p_Var1[1]._M_left = (_Base_ptr)((double)p_Var1[1]._M_left + *delta_y);
    p_Var1[1]._M_right = (_Base_ptr)((double)p_Var1[1]._M_right + *delta_z);
  }
  return 0;
}

Assistant:

int GEO::geofile::translate_data(   const double &delta_x,
                                    const double &delta_y,
                                    const double &delta_z )
{
    make_coherent(true);
    simplify_data();
    auto end = points_map.end();
    for (auto i = points_map.begin(); i != end; i++)
    {
        translate_point(i->second, delta_x, delta_y, delta_z);
    }
    return EXIT_SUCCESS;
}